

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_animatable_default<tinyusdz::value::normal3f>
                   (string *__return_storage_ptr__,Animatable<tinyusdz::value::normal3f> *v,
                   uint32_t indent)

{
  bool bVar1;
  allocator local_1b5;
  undefined1 local_1b4 [8];
  normal3f a;
  stringstream ss;
  ostream aoStack_198 [380];
  uint32_t local_1c;
  Animatable<tinyusdz::value::normal3f> *pAStack_18;
  uint32_t indent_local;
  Animatable<tinyusdz::value::normal3f> *v_local;
  
  local_1c = indent;
  pAStack_18 = v;
  v_local = (Animatable<tinyusdz::value::normal3f> *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&a.y);
  bVar1 = Animatable<tinyusdz::value::normal3f>::is_blocked(pAStack_18);
  if (bVar1) {
    ::std::operator<<(aoStack_198,"None");
  }
  bVar1 = Animatable<tinyusdz::value::normal3f>::has_value(pAStack_18);
  if (bVar1) {
    bVar1 = Animatable<tinyusdz::value::normal3f>::get_scalar(pAStack_18,(normal3f *)local_1b4);
    if (!bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"[Animatable: InternalError]",&local_1b5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1b5);
      goto LAB_0043ba6e;
    }
    ::std::operator<<(aoStack_198,(normal3f *)local_1b4);
  }
  ::std::__cxx11::stringstream::str();
LAB_0043ba6e:
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&a.y);
  return __return_storage_ptr__;
}

Assistant:

std::string print_animatable_default(const Animatable<T> &v,
                             const uint32_t indent = 0) {
  (void)indent;

  std::stringstream ss;

  if (v.is_blocked()) {
    ss << "None";
  }

  if (v.has_value()) {
    T a;
    if (!v.get_scalar(&a)) {
      return "[Animatable: InternalError]";
    }
    ss << a;
  }

  return ss.str();
}